

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileOptions::FileOptions(FileOptions *this,Arena *arena,bool is_message_owned)

{
  Message::Message(&this->super_Message,arena,is_message_owned);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileOptions_004dd688;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  this->_has_bits_ = (uint32_t  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  SharedCtor(this);
  return;
}

Assistant:

FileOptions::FileOptions(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena, is_message_owned),
  _extensions_(arena),
  uninterpreted_option_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:google.protobuf.FileOptions)
}